

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> * __thiscall
math::wide_integer::uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::operator*=
          (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *this,
          uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *other)

{
  undefined1 local_30 [8];
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> other_as_self_copy;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *other_local;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *this_local;
  
  other_as_self_copy.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)other;
  if (this == other) {
    uintwide_t((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_30,other);
    void_math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    eval_mul_unary<131072u>(math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>&,math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>const&,std::enable_if<((131072u)/std::numeric_limits<unsigned_int>::
    digits)>=math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    number_of_limbs_karatsuba_threshold,void>::type__
              (this,(uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_30,
               (enable_if_t<((131072U___std::numeric_limits<unsigned_int>::digits)_>__number_of_limbs_karatsuba_threshold_>
                *)0x0);
    ~uintwide_t((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_30);
  }
  else {
    void_math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    eval_mul_unary<131072u>(math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>&,math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>const&,std::enable_if<((131072u)/std::numeric_limits<unsigned_int>::
    digits)>=math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    number_of_limbs_karatsuba_threshold,void>::type__
              (this,other,
               (enable_if_t<((131072U___std::numeric_limits<unsigned_int>::digits)_>__number_of_limbs_karatsuba_threshold_>
                *)0x0);
  }
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }